

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaError Pa_UpdateAvailableDeviceList(void)

{
  int iVar1;
  PaUtilHostApiRepresentation *pPVar2;
  PaError PVar3;
  PaUtilHostApiRepresentation *hostApi_2;
  int baseDeviceIndex;
  PaUtilHostApiRepresentation *hostApi_1;
  int j;
  PaUtilHostApiRepresentation *hostApi;
  void *pvStack_20;
  int i;
  int *deviceCounts;
  void **scanResults;
  PaError result;
  
  scanResults._4_4_ = 0;
  deviceCounts = (int *)0x0;
  pvStack_20 = (void *)0x0;
  if (initializationCount_ == 0) {
    scanResults._4_4_ = -10000;
  }
  else {
    deviceCounts = (int *)PaUtil_AllocateMemory((long)hostApisCount_ << 3);
    if (deviceCounts == (int *)0x0) {
      scanResults._4_4_ = -0x2708;
    }
    else {
      pvStack_20 = PaUtil_AllocateMemory((long)hostApisCount_ << 2);
      if (pvStack_20 == (void *)0x0) {
        scanResults._4_4_ = -0x2708;
      }
      else {
        hostApi._4_4_ = 0;
        while ((hostApi._4_4_ < hostApisCount_ &&
               ((pPVar2 = hostApis_[hostApi._4_4_],
                pPVar2->ScanDeviceInfos ==
                (_func_PaError_PaUtilHostApiRepresentation_ptr_PaHostApiIndex_void_ptr_ptr_int_ptr *
                )0x0 || (PVar3 = (*pPVar2->ScanDeviceInfos)
                                           (pPVar2,hostApi._4_4_,
                                            (void **)(deviceCounts + (long)hostApi._4_4_ * 2),
                                            (int *)((long)pvStack_20 + (long)hostApi._4_4_ * 4)),
                        PVar3 == 0))))) {
          hostApi._4_4_ = hostApi._4_4_ + 1;
        }
        if (hostApi._4_4_ < hostApisCount_) {
          for (hostApi_1._4_4_ = 0; hostApi_1._4_4_ < hostApi._4_4_;
              hostApi_1._4_4_ = hostApi_1._4_4_ + 1) {
            pPVar2 = hostApis_[hostApi_1._4_4_];
            if (pPVar2->DisposeDeviceInfos !=
                (_func_PaError_PaUtilHostApiRepresentation_ptr_void_ptr_int *)0x0) {
              (*pPVar2->DisposeDeviceInfos)
                        (pPVar2,*(void **)(deviceCounts + (long)hostApi_1._4_4_ * 2),
                         *(int *)((long)pvStack_20 + (long)hostApi_1._4_4_ * 4));
            }
          }
        }
        else {
          hostApi_2._4_4_ = 0;
          deviceCount_ = 0;
          for (hostApi._4_4_ = 0; hostApi._4_4_ < hostApisCount_; hostApi._4_4_ = hostApi._4_4_ + 1)
          {
            pPVar2 = hostApis_[hostApi._4_4_];
            if (pPVar2->CommitDeviceInfos ==
                (_func_PaError_PaUtilHostApiRepresentation_ptr_PaHostApiIndex_void_ptr_int *)0x0) {
              iVar1 = (pPVar2->info).deviceCount;
              deviceCount_ = (pPVar2->info).deviceCount + deviceCount_;
            }
            else {
              PVar3 = (*pPVar2->CommitDeviceInfos)
                                (pPVar2,hostApi._4_4_,
                                 *(void **)(deviceCounts + (long)hostApi._4_4_ * 2),
                                 *(int *)((long)pvStack_20 + (long)hostApi._4_4_ * 4));
              if (PVar3 != 0) {
                scanResults._4_4_ = -0x2702;
                break;
              }
              if ((pPVar2->info).deviceCount <= (pPVar2->info).defaultInputDevice) {
                __assert_fail("hostApi->info.defaultInputDevice < hostApi->info.deviceCount",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/common/pa_front.c"
                              ,0x34c,"PaError Pa_UpdateAvailableDeviceList(void)");
              }
              if ((pPVar2->info).deviceCount <= (pPVar2->info).defaultOutputDevice) {
                __assert_fail("hostApi->info.defaultOutputDevice < hostApi->info.deviceCount",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/common/pa_front.c"
                              ,0x34d,"PaError Pa_UpdateAvailableDeviceList(void)");
              }
              (pPVar2->privatePaFrontInfo).baseDeviceIndex = (long)hostApi_2._4_4_;
              if ((pPVar2->info).defaultInputDevice != -1) {
                (pPVar2->info).defaultInputDevice =
                     hostApi_2._4_4_ + (pPVar2->info).defaultInputDevice;
              }
              if ((pPVar2->info).defaultOutputDevice != -1) {
                (pPVar2->info).defaultOutputDevice =
                     hostApi_2._4_4_ + (pPVar2->info).defaultOutputDevice;
              }
              iVar1 = (pPVar2->info).deviceCount;
              deviceCount_ = (pPVar2->info).deviceCount + deviceCount_;
            }
            hostApi_2._4_4_ = iVar1 + hostApi_2._4_4_;
          }
        }
      }
    }
  }
  if (deviceCounts != (int *)0x0) {
    PaUtil_FreeMemory(deviceCounts);
  }
  if (pvStack_20 != (void *)0x0) {
    PaUtil_FreeMemory(pvStack_20);
  }
  return scanResults._4_4_;
}

Assistant:

PaError Pa_UpdateAvailableDeviceList( void )
{
    PaError result     = paNoError;
    void **scanResults = NULL;
    int  *deviceCounts = NULL;
    int i = 0;

    PA_LOGAPI_ENTER( "Pa_UpdateAvailableDeviceList" );
    if( !PA_IS_INITIALISED_ )
    {
        result = paNotInitialized;
        goto done;
    }

    /* Allocate data structures used in 2-stage commit */
    scanResults = (void **) PaUtil_AllocateMemory( sizeof(void*) * hostApisCount_ );
    if( !scanResults )
    {
        result = paInsufficientMemory;
        goto done;
    }

    deviceCounts = ( int * ) PaUtil_AllocateMemory( sizeof( int ) * hostApisCount_ );
    if( !deviceCounts )
    {
        result = paInsufficientMemory;
        goto done;
    }

    /* Phase 1: Perform a scan of new devices */
    for( i = 0 ; i < hostApisCount_ ; ++i )
    {
        PaUtilHostApiRepresentation *hostApi = hostApis_[i];
        PA_DEBUG(( "Scanning new device list for host api %d.\n",i));
        if( hostApi->ScanDeviceInfos == NULL )
            continue;

        if( hostApi->ScanDeviceInfos( hostApi, i, &scanResults[ i ], &deviceCounts[ i ] ) != paNoError )
            break;
    }

    /* Check the result of the scan operation */
    if( i < hostApisCount_ )
    {
        /* If failure, rollback the scan changes back to original state */
        int j = 0;
        for( j = 0 ; j < i ; ++j )
        {
            PaUtilHostApiRepresentation *hostApi = hostApis_[j];
            if( hostApi->DisposeDeviceInfos == NULL )
                continue;

            PA_DEBUG(( "Performing rollback for device list scan for host api %d.\n",i));
            hostApi->DisposeDeviceInfos( hostApi, scanResults[ j ], deviceCounts[ j ] );
        }
    }
    else
    {
        int baseDeviceIndex = 0;
        deviceCount_ = 0;

        /* Otherwise, commit the scan changes to each back-end */
        for( i = 0 ; i < hostApisCount_ ; ++i )
        {
            PaUtilHostApiRepresentation *hostApi = hostApis_[i];
            if( hostApi->CommitDeviceInfos == NULL )
            {
                /* Not yet implemented for this backend. Just
                   assume that the baseDeviceIndex and the paInternalInfo_.deviceCount_ are
                   incremented according to the values in the info */
                baseDeviceIndex += hostApi->info.deviceCount;
                deviceCount_ += hostApi->info.deviceCount;
                continue;
            }

            PA_DEBUG(( "Committing device list scan for host api %d.\n",i));
            if( hostApi->CommitDeviceInfos( hostApi, i, scanResults[ i ], deviceCounts[ i ] ) != paNoError )
            {
                PA_DEBUG(( "Committing failed (shouldn't happen) %d.\n",i));
                result = paInternalError;
                goto done;
            }

            assert( hostApi->info.defaultInputDevice < hostApi->info.deviceCount );
            assert( hostApi->info.defaultOutputDevice < hostApi->info.deviceCount );

            hostApi->privatePaFrontInfo.baseDeviceIndex = baseDeviceIndex;

            if( hostApi->info.defaultInputDevice != paNoDevice )
                hostApi->info.defaultInputDevice += baseDeviceIndex;

            if( hostApi->info.defaultOutputDevice != paNoDevice )
                hostApi->info.defaultOutputDevice += baseDeviceIndex;

            baseDeviceIndex += hostApi->info.deviceCount;
            deviceCount_ += hostApi->info.deviceCount;
        }
    }

done:

    if( scanResults )
        PaUtil_FreeMemory( scanResults );

    if( deviceCounts )
        PaUtil_FreeMemory( deviceCounts );

    return result;
}